

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O3

atom * findTouchingAtoms(atom *src,atom *head,atomBins *abins,float probeRad,int targFlg,int *ok)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  atomPtr b;
  uint uVar12;
  double dVar13;
  int jz;
  int jy;
  int jx;
  ulong local_90;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_74 = src->ix;
  local_78 = src->iy;
  local_7c = src->iz;
  if (src->binSerialNum != abins->binSerialNum) {
    dVar1 = (src->loc).x;
    dVar13 = (double)abins->delta;
    if (((((dVar1 < (abins->min).x - dVar13) ||
          (dVar2 = (src->loc).y, dVar2 < (abins->min).y - dVar13)) ||
         (dVar3 = (src->loc).z, dVar3 < (abins->min).z - dVar13)) ||
        (((abins->max).x + dVar13 < dVar1 || ((abins->max).y + dVar13 < dVar2)))) ||
       (dVar13 + (abins->max).z < dVar3)) {
      return (atom *)0x0;
    }
    binLoc(&src->loc,(int *)&local_74,(int *)&local_78,(int *)&local_7c,abins);
  }
  uVar5 = 2;
  if (2 < (int)local_74) {
    uVar5 = local_74;
  }
  iVar10 = abins->nx + -2;
  if ((int)local_74 < iVar10) {
    iVar10 = local_74 + 1;
  }
  uVar12 = 0;
  if ((int)(uVar5 - 1) <= iVar10) {
    uVar7 = abins->nz - 2;
    uVar4 = local_7c + 1;
    if ((int)uVar7 <= (int)local_7c) {
      uVar4 = uVar7;
    }
    local_40 = (ulong)uVar4;
    uVar8 = abins->ny - 2;
    uVar7 = local_78 + 1;
    if ((int)uVar8 <= (int)local_78) {
      uVar7 = uVar8;
    }
    local_68 = (ulong)uVar7;
    uVar9 = (ulong)local_7c;
    if ((int)local_7c < 3) {
      uVar9 = 2;
    }
    uVar8 = 2;
    if (2 < (int)local_78) {
      uVar8 = local_78;
    }
    local_50 = uVar9 - 1;
    local_38 = (ulong)(uVar4 + 1);
    local_58 = (ulong)uVar8 - 1;
    local_48 = (ulong)(uVar7 + 1);
    local_90 = (ulong)uVar5 - 1;
    local_60 = (ulong)(iVar10 + 1);
    local_70 = (uint *)ok;
    do {
      uVar11 = local_58;
      if ((int)(uVar8 - 1) <= (int)local_68) {
        do {
          uVar6 = local_50;
          if ((int)uVar9 + -1 <= (int)local_40) {
            do {
              for (b = abins->list[local_90][uVar11][uVar6]; b != (atom *)0x0; b = b->nextInBin) {
                iVar10 = src->r->model;
                if ((((iVar10 == b->r->model) && ((modelLimit < 2 || (iVar10 == modelToProcess))))
                    && ((b->altConf == ' ' ||
                        ((src->altConf == ' ' || (src->altConf == b->altConf)))))) &&
                   (iVar10 = atomsClose(src,b,probeRad), iVar10 != 0)) {
                  b->mark = 0;
                  b->scratch = head;
                  uVar12 = (uVar12 + 1) - (uint)((b->flags & targFlg) == 0);
                  head = b;
                }
              }
              uVar6 = uVar6 + 1;
            } while (uVar6 != local_38);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != local_48);
      }
      local_90 = local_90 + 1;
    } while (local_90 != local_60);
    uVar12 = (uint)(0 < (int)uVar12);
    ok = (int *)local_70;
  }
  src->mark = 0;
  *ok = (uint)(byte)(targFlg == 0 | (byte)uVar12);
  return head;
}

Assistant:

atom* findTouchingAtoms(atom *src, atom *head, atomBins *abins,
			   float probeRad, int targFlg, int *ok)
{/*findTouchingAtoms()*/
   atom *a = NULL;
   int i = 0, j = 0, k = 0, nearpt = 0, targcount = 0;
   int jx = (src->ix), jy = (src->iy), jz = (src->iz);
   int imin = 0, jmin = 0, kmin = 0;
   int imax = 0, jmax = 0, kmax = 0;

   if (src->binSerialNum != abins->binSerialNum)
   {/*in foreign bins */
      /*dcr?: why do they have to be in foreign==different bins??*/
      /*this requirement seems not to affect loss of close clashes*/

      /* must look up the positions */

      if(  (src->loc.x < (abins->min.x - abins->delta))
	|| (src->loc.y < (abins->min.y - abins->delta))
	|| (src->loc.z < (abins->min.z - abins->delta))
	|| (src->loc.x > (abins->max.x + abins->delta))
	|| (src->loc.y > (abins->max.y + abins->delta))
	|| (src->loc.z > (abins->max.z + abins->delta)) )
      {
	 return NULL; /* nothing anywhere nearby */
      }
      binLoc(&(src->loc), &jx, &jy, &jz, abins);

#ifdef DEBUG_A2B
fprintf(stderr, "f(%c != %c) %s%d %s [%d, %d, %d] <1..%d, 1..%d, 1..%d>\n",
   src->binSerialNum, abins->binSerialNum,
   src->r->resname, src->r->resid, src->atomname, jx, jy, jz, abins->nx-2, abins->ny-2, abins->nz-2);
#endif

   }/*in foreign bins */

   imin = jx-1; imax = jx+1; /* bin ranges */
   jmin = jy-1; jmax = jy+1;
   kmin = jz-1; kmax = jz+1;

   /* trim any excess edges */
   if (imin < 1)               { imin = 1; }
   if (jmin < 1)               { jmin = 1; }
   if (kmin < 1)               { kmin = 1; }
   if (imax > (abins->nx - 2)) { imax = (abins->nx - 2); }
   if (jmax > (abins->ny - 2)) { jmax = (abins->ny - 2); }
   if (kmax > (abins->nz - 2)) { kmax = (abins->nz - 2); }

   for(i = imin; i <= imax; i++) {
      for(j = jmin; j <= jmax; j++) {
         for(k = kmin; k <= kmax; k++) {

	    for(a = abins->list[i][j][k]; a; a = a->nextInBin) {

               /*Lmodeltest for interaction of diff. models 041112*/
               /*050121 Lmodeltest superseded, mage sends model# */
               /*...within subroutine findTouchingAtoms()... */
	       if( (src->r->model != a->r->model) ) { continue; }
               if( modelLimit > 1 ) /*041114*/
               {/*looping through multiple models*/
                  if(src->r->model != modelToProcess) { continue; }
               }

               /*if (( src->r  == a->r)            && -- alternate      */
                                                    /* alternate      */
	       if (( src->altConf != a->altConf) && /* conformations  */
	           ( src->altConf != ' ')        && /* don't interact */
	           (   a->altConf != ' ')     ) { continue; }
            
    
/*nearpt seems to be essential to get any dots or spikes */
/*...seems not to be where too-close atoms fail to get any dots or spikes*/
	       nearpt = atomsClose(src, a, probeRad);/*only call to atomsClose*/
	       if (nearpt)
               {/*add this atom to the linked-list of those touching src atom*/
		  a->mark = 0;       /* clear the bonding marker.   */
		  a->scratch = head; /* link using scratch pointers */
		  head = a;          /* with <a> at head of list    */

		  if (a->flags & targFlg) { targcount++; }
           }
        }
     }
    }
   }
   src->mark = 0;       /* clear the src atom bonding marker.   */

   *ok = !(targFlg && (targcount < 1));

   return head;
}